

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_PartialEquivalencyNotEqualTest_Test::
TestBody(MessageDifferencerTest_PartialEquivalencyNotEqualTest_Test *this)

{
  bool bVar1;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  TestAllTypes msg2;
  TestAllTypes msg1;
  AssertHelper local_880;
  Message local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_870;
  AssertHelper local_868;
  undefined1 local_860 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_850;
  undefined1 local_840 [432];
  TestAllTypes local_690;
  TestAllTypes local_350;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_690,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_350);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_690);
  local_350.field_0._impl_.optional_int32_ = 0;
  local_350.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
       local_350.field_0._impl_._has_bits_.has_bits_[0]._1_1_ | 0x10;
  local_690.field_0._impl_.optional_int32_ = 0;
  local_690.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
       local_690.field_0._impl_._has_bits_.has_bits_[0]._1_1_ & 0xef;
  bVar1 = util::MessageDifferencer::Equals(&local_350.super_Message,&local_690.super_Message);
  local_860[0] = (internal)!bVar1;
  local_858 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message(&local_878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_840,(internal *)local_860,
               (AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x30e,(char *)local_840._0_8_);
    testing::internal::AssertHelper::operator=(&local_880,&local_878);
    testing::internal::AssertHelper::~AssertHelper(&local_880);
    if ((undefined1 *)local_840._0_8_ != local_840 + 0x10) {
      operator_delete((void *)local_840._0_8_,local_840._16_8_ + 1);
    }
    if ((long *)CONCAT71(local_878.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_878.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_878.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_878.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_858 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_858,local_858);
  }
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_840);
  util::MessageDifferencer::set_message_field_comparison((MessageDifferencer *)local_840,EQUIVALENT)
  ;
  util::MessageDifferencer::set_scope((MessageDifferencer *)local_840,PARTIAL);
  local_878.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       util::MessageDifferencer::Compare
                 ((MessageDifferencer *)local_840,&local_350.super_Message,&local_690.super_Message)
  ;
  local_870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_878.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_880);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_860,(internal *)&local_878,(AssertionResult *)0x126d6fd,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x313,(char *)CONCAT71(local_860._1_7_,local_860[0]));
    testing::internal::AssertHelper::operator=(&local_868,(Message *)&local_880);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_860._1_7_,local_860[0]) != &local_850) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_860._1_7_,local_860[0]),local_850._M_allocated_capacity + 1)
      ;
    }
    if (local_880.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_880.data_ + 8))();
    }
  }
  if (local_870 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_870,local_870);
  }
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_840);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  return;
}

Assistant:

TEST(MessageDifferencerTest, PartialEquivalencyNotEqualTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  msg1.set_optional_int32(0);
  msg2.clear_optional_int32();

  // Compare
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}